

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::GeneratorContextImpl
          (GeneratorContextImpl *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_GeneratorContext)._vptr_GeneratorContext =
       (_func_int **)&PTR__GeneratorContextImpl_00199900;
  p_Var1 = &(this->files_)._M_t._M_impl.super__Rb_tree_header;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->parsed_files_ = parsed_files;
  this->had_error_ = false;
  return;
}

Assistant:

CommandLineInterface::GeneratorContextImpl::GeneratorContextImpl(
    const vector<const FileDescriptor*>& parsed_files)
    : parsed_files_(parsed_files),
      had_error_(false) {
}